

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O0

StringPiece * __thiscall re2::StringGenerator::Next(StringGenerator *this)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  bool local_1f9;
  StringPiece local_1d0;
  ulong local_1c0;
  size_t i;
  int local_1b0;
  LogMessage local_198;
  StringGenerator *local_18;
  StringGenerator *this_local;
  
  local_18 = this;
  if ((this->hasnext_ & 1U) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/string_generator.cc"
               ,0x50);
    poVar2 = LogMessage::stream(&local_198);
    std::operator<<(poVar2,"Check failed: hasnext_");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if ((this->generate_null_ & 1U) == 0) {
    std::__cxx11::string::clear();
    for (local_1c0 = 0; uVar1 = local_1c0,
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->digits_), uVar1 < sVar3;
        local_1c0 = local_1c0 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->digits_,local_1c0);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->alphabet_,(long)*pvVar4);
      std::__cxx11::string::operator+=((string *)&this->s_,(string *)pvVar5);
    }
    if ((this->random_ & 1U) == 0) {
      local_1f9 = IncrementDigits(this);
    }
    else {
      local_1f9 = RandomDigits(this);
    }
    this->hasnext_ = local_1f9;
    StringPiece::StringPiece(&local_1d0,&this->s_);
    (this->sp_).ptr_ = local_1d0.ptr_;
    (this->sp_).length_ = local_1d0.length_;
  }
  else {
    this->generate_null_ = false;
    StringPiece::StringPiece((StringPiece *)&i,(char *)0x0);
    (this->sp_).ptr_ = (char *)i;
    (this->sp_).length_ = local_1b0;
  }
  this_local = (StringGenerator *)&this->sp_;
  return (StringPiece *)this_local;
}

Assistant:

const StringPiece& StringGenerator::Next() {
  CHECK(hasnext_);
  if (generate_null_) {
    generate_null_ = false;
    sp_ = NULL;
    return sp_;
  }
  s_.clear();
  for (size_t i = 0; i < digits_.size(); i++) {
    s_ += alphabet_[digits_[i]];
  }
  hasnext_ = random_ ? RandomDigits() : IncrementDigits();
  sp_ = s_;
  return sp_;
}